

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-accesses.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_70;
  vector<int_*,_std::allocator<int_*>_> pointers;
  vector<int,_std::allocator<int>_> data;
  
  if (argc < 3) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Usage: random-accesses <shuffle> <size>");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar1 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&data,argv[1],(allocator *)&pointers);
    iVar1 = std::__cxx11::stoi((string *)&data,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&data);
    std::__cxx11::string::string((string *)&data,argv[2],(allocator *)&pointers);
    iVar2 = std::__cxx11::stoi((string *)&data,(size_t *)0x0,10);
    uVar6 = iVar2 >> 2;
    std::__cxx11::string::~string((string *)&data);
    pointers.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((ulong)pointers.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_ << 0x20);
    std::vector<int,_std::allocator<int>_>::vector
              (&data,(long)(int)uVar6,(value_type_conflict *)&pointers,(allocator_type *)&local_70);
    pointers.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pointers.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    pointers.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    uVar5 = 0;
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar5;
    }
    for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      *(int *)((long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar5) = (int)uVar4;
      local_70._M_x =
           (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + uVar5;
      std::vector<int*,std::allocator<int*>>::emplace_back<int*>
                ((vector<int*,std::allocator<int*>> *)&pointers,(int **)&local_70);
      uVar5 = uVar5 + 4;
    }
    if (iVar1 == 1) {
      local_70._M_x = 1;
      std::
      shuffle<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                ((__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)
                 pointers.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)
                 pointers.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_70);
    }
    test_memory(&pointers);
    std::_Vector_base<int_*,_std::allocator<int_*>_>::~_Vector_base
              (&pointers.super__Vector_base<int_*,_std::allocator<int_*>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&data.super__Vector_base<int,_std::allocator<int>_>);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 3)
    {
        std::cout << "Usage: random-accesses <shuffle> <size>" << std::endl;
        return 1;
    }

    int shuffle = std::stoi(argv[1]);
    int size = std::stoi(argv[2]) / sizeof(Type);

    std::vector<Type> data(size, 0);
    std::vector<Type*> pointers;
    for (int i = 0; i < size; i++)
    {
        data[i] = i;
        pointers.push_back(data.data() + i);
    }

    if (shuffle == 1)
    {
        std::default_random_engine rng;
        rng.seed(0);
        std::shuffle(pointers.begin(), pointers.end(), rng);
    }

    test_memory(pointers);

    return 0;
}